

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_put_bucket_policy(void)

{
  code *pcVar1;
  char *__s;
  OssAdminPutBucketPolicyRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_2d1;
  int ret;
  HttpTestListener *local_2b0;
  HttpTestListener *listener;
  string local_2a0;
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [55];
  allocator<char> local_219;
  string local_218 [32];
  OssAdminPutBucketPolicyRequestType *local_1f8;
  OssAdmin *ossadmin;
  OssAdminPutBucketPolicyResponseType resp;
  OssAdminPutBucketPolicyRequestType req;
  
  aliyun::OssAdminPutBucketPolicyRequestType::OssAdminPutBucketPolicyRequestType
            ((OssAdminPutBucketPolicyRequestType *)&resp.success);
  aliyun::OssAdminPutBucketPolicyResponseType::OssAdminPutBucketPolicyResponseType
            ((OssAdminPutBucketPolicyResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"cn-hangzhou",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"my_appid",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"my_secret",&local_279);
  pOVar2 = (OssAdminPutBucketPolicyRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_218,local_250,local_278);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  local_1f8 = pOVar2;
  if (pOVar2 == (OssAdminPutBucketPolicyRequestType *)0x0) {
    aliyun::OssAdminPutBucketPolicyResponseType::~OssAdminPutBucketPolicyResponseType
              ((OssAdminPutBucketPolicyResponseType *)&ossadmin);
    aliyun::OssAdminPutBucketPolicyRequestType::~OssAdminPutBucketPolicyRequestType
              ((OssAdminPutBucketPolicyRequestType *)&resp.success);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_1f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_put_bucket_policy_response;
  local_2b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_2d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_2d1);
  HttpTestListener::Start(local_2b0);
  std::__cxx11::string::operator=((string *)&resp.success,"uid");
  std::__cxx11::string::operator=((string *)(req.uid.field_2._M_local_buf + 8),"bid");
  std::__cxx11::string::operator=((string *)(req.bid.field_2._M_local_buf + 8),"BucketName");
  std::__cxx11::string::operator=((string *)(req.bucket_name.field_2._M_local_buf + 8),"IamPolicy");
  std::__cxx11::string::operator=
            ((string *)(req.iam_policy.field_2._M_local_buf + 8),"DisallowEmptyRefer");
  std::__cxx11::string::operator=
            ((string *)(req.disallow_empty_refer.field_2._M_local_buf + 8),"EnableDualCluster");
  std::__cxx11::string::operator=
            ((string *)(req.enable_dual_cluster.field_2._M_local_buf + 8),"ErrorFile");
  std::__cxx11::string::operator=((string *)(req.error_file.field_2._M_local_buf + 8),"IndexFile");
  std::__cxx11::string::operator=((string *)(req.index_file.field_2._M_local_buf + 8),"Location");
  std::__cxx11::string::operator=((string *)(req.location.field_2._M_local_buf + 8),"LogBucket");
  std::__cxx11::string::operator=((string *)(req.log_bucket.field_2._M_local_buf + 8),"LogPrefix");
  std::__cxx11::string::operator=
            ((string *)(req.log_prefix.field_2._M_local_buf + 8),"WhiteReferList");
  std::__cxx11::string::operator=
            ((string *)(req.white_refer_list.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::OssAdmin::PutBucketPolicy
            (local_1f8,(OssAdminPutBucketPolicyResponseType *)&resp.success,
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_2b0);
  pHVar3 = local_2b0;
  if (local_2b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_2b0);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_1f8;
  if (local_1f8 != (OssAdminPutBucketPolicyRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_1f8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_put_bucket_policy() {
  OssAdminPutBucketPolicyRequestType req;
  OssAdminPutBucketPolicyResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_put_bucket_policy_response);
  listener->Start();
  req.uid = "uid";
  req.bid = "bid";
  req.bucket_name = "BucketName";
  req.iam_policy = "IamPolicy";
  req.disallow_empty_refer = "DisallowEmptyRefer";
  req.enable_dual_cluster = "EnableDualCluster";
  req.error_file = "ErrorFile";
  req.index_file = "IndexFile";
  req.location = "Location";
  req.log_bucket = "LogBucket";
  req.log_prefix = "LogPrefix";
  req.white_refer_list = "WhiteReferList";
  req.owner_account = "OwnerAccount";
  int ret = ossadmin->PutBucketPolicy(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}